

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bbands.c
# Opt level: O2

ErrorNumber test_func_bbands(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  uint uVar4;
  TA_Test_conflict4 *pTVar5;
  ulong uVar6;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ulong local_48;
  TA_Test_conflict4 *local_40;
  TA_Real *local_38;
  
  pTVar5 = tableTest;
  uVar3 = 0;
  while( true ) {
    if (uVar3 == 0x13) {
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < pTVar5->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,0);
    if (TVar1 != TA_SUCCESS) {
      uVar6 = 0x8a;
      goto LAB_00115fc0;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    setInputBuffer(3,history->close,history->nbBars);
    TA_SetCompatibility(pTVar5->compatibility);
    TVar1 = TA_BBANDS(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,pTVar5->optInTimePeriod,
                      pTVar5->optInNbDevUp,pTVar5->optInNbDevDn,pTVar5->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar2 != TA_TEST_PASS) {
      uVar6 = (ulong)EVar2;
      goto LAB_00115fc0;
    }
    local_48 = uVar3;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    uVar4 = 0;
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[0].out1,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal1,
                               pTVar5->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) {
LAB_00115f9c:
      uVar4 = 1;
      break;
    }
    EVar2 = checkExpectedValue(gBuffer[0].out2,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal2,
                               pTVar5->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) {
LAB_00115fa0:
      uVar4 = 2;
      break;
    }
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar5->startIdx,pTVar5->endIdx,gBuffer[1].in,pTVar5->optInTimePeriod,
                      pTVar5->optInNbDevUp,pTVar5->optInNbDevDn,pTVar5->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fbb;
    EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[1].out1,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal1,
                               pTVar5->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115f9c;
    EVar2 = checkExpectedValue(gBuffer[1].out2,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal2,
                               pTVar5->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fa0;
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar5->startIdx,pTVar5->endIdx,gBuffer[2].in,pTVar5->optInTimePeriod,
                      pTVar5->optInNbDevUp,pTVar5->optInNbDevDn,pTVar5->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
    EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[2].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fbb;
    EVar2 = checkExpectedValue(gBuffer[2].out1,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[2].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal1,
                               pTVar5->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115f9c;
    EVar2 = checkExpectedValue(gBuffer[2].out2,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal2,
                               pTVar5->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fa0;
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,pTVar5->optInTimePeriod,
                      pTVar5->optInNbDevUp,pTVar5->optInNbDevDn,pTVar5->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[3].out0,gBuffer[3].out1,gBuffer[3].in);
    EVar2 = checkSameContent(gBuffer[2].out2,gBuffer[3].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fbb;
    EVar2 = checkExpectedValue(gBuffer[3].out0,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[3].out1,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal1,
                               pTVar5->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115f9c;
    EVar2 = checkExpectedValue(gBuffer[3].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal2,
                               pTVar5->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115fa0;
    local_38 = history->close;
    local_40 = pTVar5;
    if ((pTVar5->doRangeTestFlag != 0) &&
       (EVar2 = doRangeTest(rangeTestFunction,-(uint)(pTVar5->optInMethod_3 != 1) | TA_FUNC_UNST_EMA
                            ,&local_40,3,0), EVar2 != TA_TEST_PASS)) goto LAB_00115fbb;
    uVar3 = local_48 + 1;
    pTVar5 = pTVar5 + 1;
  }
  printf("Fail for output id=%d\n",(ulong)uVar4);
LAB_00115fbb:
  uVar6 = (ulong)EVar2;
  uVar3 = local_48;
LAB_00115fc0:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
         ,uVar3 & 0xffffffff,uVar6);
  return (ErrorNumber)uVar6;
}

Assistant:

ErrorNumber test_func_bbands( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i,
                 tableTest[i].expectedNbElement,
                 history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__, i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}